

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
FillableSigningProvider::AddCScript(FillableSigningProvider *this,CScript *redeemScript)

{
  uint uVar1;
  long lVar2;
  string_view source_file;
  bool bVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  Logger *pLVar4;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  string log_msg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (redeemScript->super_CScriptBase)._size;
  if (uVar1 < 0x226) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock4,&this->cs_KeyStore,"cs_KeyStore",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/signingprovider.cpp"
               ,0xa5,false);
    CScriptID::CScriptID((CScriptID *)&log_msg,redeemScript);
    this_00 = &std::
               map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
               ::operator[](&this->mapScripts,(key_type *)&log_msg)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (this_00,&redeemScript->super_CScriptBase);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
  }
  else {
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar4);
    if (bVar3) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<unsigned_int>
                ((string *)&criticalblock4,
                 "FillableSigningProvider::AddCScript(): redeemScripts > %i bytes are invalid\n",
                 &MAX_SCRIPT_ELEMENT_SIZE);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &criticalblock4);
      std::__cxx11::string::~string((string *)&criticalblock4);
      pLVar4 = LogInstance();
      criticalblock4.super_unique_lock._M_device = (mutex_type *)0x63;
      criticalblock4.super_unique_lock._8_8_ = anon_var_dwarf_2160219;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/signingprovider.cpp"
      ;
      source_file._M_len = 99;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "AddCScript";
      logging_function._M_len = 10;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0xa1,ALL,Error);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return uVar1 < 0x226;
  }
  __stack_chk_fail();
}

Assistant:

bool FillableSigningProvider::AddCScript(const CScript& redeemScript)
{
    if (redeemScript.size() > MAX_SCRIPT_ELEMENT_SIZE) {
        LogError("FillableSigningProvider::AddCScript(): redeemScripts > %i bytes are invalid\n", MAX_SCRIPT_ELEMENT_SIZE);
        return false;
    }

    LOCK(cs_KeyStore);
    mapScripts[CScriptID(redeemScript)] = redeemScript;
    return true;
}